

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
MineBanIRCCommand::trigger
          (MineBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  PlayerInfo *pPVar4;
  undefined8 uVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  
  if (parameters._M_len == 0) {
    pcVar6 = "Error: Too Few Parameters. Syntax: mineban <player>";
    uVar5 = 0x33;
LAB_0012d584:
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar5,pcVar6);
    return;
  }
  lVar1 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar1 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    uVar7 = 0;
    bVar8 = false;
    while( true ) {
      RenX::getCore();
      uVar2 = RenX::Core::getServerCount();
      if (uVar2 == uVar7) break;
      uVar2 = RenX::getCore();
      pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar2);
      cVar3 = RenX::Server::isLogChanType((int)pPVar4);
      if (cVar3 != '\0') {
        lVar1 = RenX::Server::getPlayerByPartName(pPVar4,parameters._M_len,parameters._M_str);
        if (lVar1 == 0) {
          Jupiter::IRC::Client::sendNotice
                    (source,nick._M_len,nick._M_str,0x18,"Error: Player not found.");
        }
        else {
          RenX::Server::mineBan(pPVar4);
          Jupiter::IRC::Client::sendMessage
                    (source,channel._M_len,channel._M_str,0x21,"Player can no longer place mines.");
        }
        bVar8 = true;
      }
      uVar7 = uVar7 + 1;
    }
    if (!bVar8) {
      pcVar6 = "Error: Channel not attached to any connected Renegade X servers.";
      uVar5 = 0x40;
      goto LAB_0012d584;
    }
  }
  return;
}

Assistant:

void MineBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						server->mineBan(*player);
						source->sendMessage(channel, "Player can no longer place mines."sv);
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: mineban <player>"sv);
}